

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluk.c
# Opt level: O3

int fffi8uint(LONGLONG *input,long ntodo,double scale,double zero,int nullcheck,LONGLONG tnull,
             uint nullval,char *nullarray,int *anynull,uint *output,int *status)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 9.223372036854776e+18) {
      if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
        if (0 < ntodo) {
          lVar4 = 0;
          do {
            dVar5 = (double)input[lVar4] * scale + zero;
            if (-0.49 <= dVar5) {
              if (dVar5 <= 4294967295.49) {
                uVar1 = (uint)(long)dVar5;
              }
              else {
                *status = -0xb;
                uVar1 = 0xffffffff;
              }
            }
            else {
              *status = -0xb;
              uVar1 = 0;
            }
            output[lVar4] = uVar1;
            lVar4 = lVar4 + 1;
          } while (ntodo != lVar4);
        }
      }
      else if (0 < ntodo) {
        lVar4 = 0;
        do {
          uVar2 = input[lVar4];
          if ((long)uVar2 < 0) {
            *status = -0xb;
            uVar2 = 0;
          }
          else if (uVar2 >> 0x20 != 0) {
            *status = -0xb;
            uVar2 = 0xffffffff;
          }
          output[lVar4] = (uint)uVar2;
          lVar4 = lVar4 + 1;
        } while (ntodo != lVar4);
      }
    }
    else if (0 < ntodo) {
      lVar4 = 0;
      do {
        lVar3 = input[lVar4];
        if (-0x7fffffff00000001 < lVar3) {
          *status = -0xb;
          lVar3 = 0xffffffff;
        }
        output[lVar4] = (uint)lVar3;
        lVar4 = lVar4 + 1;
      } while (ntodo != lVar4);
    }
  }
  else if (scale != 1.0 || zero != 9.223372036854776e+18) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      if (0 < ntodo) {
        lVar4 = 0;
        do {
          if (input[lVar4] == tnull) {
            *anynull = 1;
            if (nullcheck == 1) {
              output[lVar4] = nullval;
            }
            else {
              nullarray[lVar4] = '\x01';
            }
          }
          else {
            dVar5 = (double)input[lVar4] * scale + zero;
            if (-0.49 <= dVar5) {
              if (dVar5 <= 4294967295.49) {
                output[lVar4] = (uint)(long)dVar5;
              }
              else {
                *status = -0xb;
                output[lVar4] = 0xffffffff;
              }
            }
            else {
              *status = -0xb;
              output[lVar4] = 0;
            }
          }
          lVar4 = lVar4 + 1;
        } while (ntodo != lVar4);
      }
    }
    else if (0 < ntodo) {
      lVar4 = 0;
      do {
        uVar2 = input[lVar4];
        if (uVar2 == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar4] = nullval;
          }
          else {
            nullarray[lVar4] = '\x01';
          }
        }
        else if ((long)uVar2 < 0) {
          *status = -0xb;
          output[lVar4] = 0;
        }
        else if (uVar2 >> 0x20 == 0) {
          output[lVar4] = (uint)uVar2;
        }
        else {
          *status = -0xb;
          output[lVar4] = 0xffffffff;
        }
        lVar4 = lVar4 + 1;
      } while (ntodo != lVar4);
    }
  }
  else if (0 < ntodo) {
    lVar4 = 0;
    do {
      lVar3 = input[lVar4];
      if (lVar3 == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar4] = nullval;
        }
        else {
          nullarray[lVar4] = '\x01';
        }
      }
      else if (lVar3 < -0x7fffffff00000000) {
        output[lVar4] = (uint)lVar3;
      }
      else {
        *status = -0xb;
        output[lVar4] = 0xffffffff;
      }
      lVar4 = lVar4 + 1;
    } while (ntodo != lVar4);
  }
  return *status;
}

Assistant:

int fffi8uint(LONGLONG *input,    /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            LONGLONG tnull,       /* I - value of FITS TNULLn keyword if any */
   unsigned int  nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned int  *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    ULONGLONG ulltemp;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of adding 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);

                if (ulltemp > UINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UINT_MAX;
                }
                else
                    output[ii] = (unsigned int) ulltemp;
            }
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < 0)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > UINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UINT_MAX;
                }
                else
                    output[ii] = (unsigned int) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DUINT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DUINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UINT_MAX;
                }
                else
                    output[ii] = (unsigned int) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of adding 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);

                    if (ulltemp > UINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UINT_MAX;
                    }
                    else
		    {
                        output[ii] = (unsigned int) ulltemp;
		    }
                }
            }
        }
        else if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    if (input[ii] < 0)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > UINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UINT_MAX;
                    }
                    else
                        output[ii] = (unsigned int) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DUINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DUINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UINT_MAX;
                    }
                    else
                        output[ii] = (unsigned int) dvalue;
                }
            }
        }
    }
    return(*status);
}